

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

void InvalidateBlock(ChainstateManager *chainman,uint256 block_hash)

{
  bool bVar1;
  CBlockIndex *this;
  string *message;
  undefined8 uVar2;
  long in_FS_OFFSET;
  CBlockIndex *pblockindex;
  Chainstate *in_stack_00000090;
  Chainstate *in_stack_00000098;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock46;
  BlockValidationState state;
  ChainstateManager *in_stack_fffffffffffffeb8;
  ChainstateManager *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  BlockManager *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffef0;
  ValidationState<BlockValidationResult> *in_stack_fffffffffffffef8;
  char *__s;
  int code;
  char local_a1 [153];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  BlockValidationState::BlockValidationState((BlockValidationState *)in_stack_fffffffffffffeb8);
  ChainstateManager::GetMutex(in_stack_fffffffffffffeb8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffeb8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0,
             (char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffed8 >> 0x18,0));
  this = node::BlockManager::LookupBlockIndex
                   (in_stack_fffffffffffffed8,
                    (uint256 *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  if (this == (CBlockIndex *)0x0) {
    message = (string *)__cxa_allocate_exception(0x58);
    __s = local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,__s,
               (allocator<char> *)message);
    JSONRPCError((int)((ulong)this >> 0x20),message);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(message,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffeb8);
    code = (int)((ulong)this >> 0x20);
    ChainstateManager::ActiveChainstate(in_stack_fffffffffffffec8);
    Chainstate::InvalidateBlock
              (in_stack_00000098,(BlockValidationState *)in_stack_00000090,(CBlockIndex *)chainman);
    bVar1 = ValidationState<BlockValidationResult>::IsValid
                      ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffffeb8);
    if (bVar1) {
      ChainstateManager::ActiveChainstate(in_stack_fffffffffffffec8);
      std::shared_ptr<const_CBlock>::shared_ptr
                ((shared_ptr<const_CBlock> *)in_stack_fffffffffffffeb8,(nullptr_t)0x127148d);
      Chainstate::ActivateBestChain
                (in_stack_00000090,(BlockValidationState *)chainman,
                 (shared_ptr<const_CBlock> *)pblockindex);
      std::shared_ptr<const_CBlock>::~shared_ptr
                ((shared_ptr<const_CBlock> *)in_stack_fffffffffffffeb8);
    }
    bVar1 = ValidationState<BlockValidationResult>::IsValid
                      ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffffeb8);
    if (bVar1) {
      BlockValidationState::~BlockValidationState((BlockValidationState *)in_stack_fffffffffffffeb8)
      ;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
    }
    else {
      uVar2 = __cxa_allocate_exception(0x58);
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_(in_stack_fffffffffffffef8);
      JSONRPCError(code,(string *)in_stack_fffffffffffffef8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

void InvalidateBlock(ChainstateManager& chainman, const uint256 block_hash) {
    BlockValidationState state;
    CBlockIndex* pblockindex;
    {
        LOCK(chainman.GetMutex());
        pblockindex = chainman.m_blockman.LookupBlockIndex(block_hash);
        if (!pblockindex) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }
    }
    chainman.ActiveChainstate().InvalidateBlock(state, pblockindex);

    if (state.IsValid()) {
        chainman.ActiveChainstate().ActivateBestChain(state);
    }

    if (!state.IsValid()) {
        throw JSONRPCError(RPC_DATABASE_ERROR, state.ToString());
    }
}